

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O2

void __thiscall
DPillar::DPillar(DPillar *this,sector_t *sector,EPillar type,double speed,double floordist,
                double ceilingdist,int crush,bool hexencrush)

{
  DInterpolation *pDVar1;
  double dVar2;
  double dVar3;
  double local_58;
  double local_50;
  vertex_t *spot;
  FName local_3c;
  double local_38;
  
  local_38 = speed;
  DMover::DMover(&this->super_DMover,sector);
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_007cc5d8;
  (sector->ceilingdata).field_0.p = (DSectorEffect *)this;
  (sector->floordata).field_0.p = (DSectorEffect *)this;
  pDVar1 = sector_t::SetInterpolation(sector,1,true);
  (this->m_Interp_Floor).field_0.p = pDVar1;
  pDVar1 = sector_t::SetInterpolation(sector,0,true);
  (this->m_Interp_Ceiling).field_0.p = pDVar1;
  this->m_Type = type;
  this->m_Crush = crush;
  this->m_Hexencrush = hexencrush;
  local_50 = floordist;
  if (type == pillarBuild) {
    if ((floordist != 0.0) || (NAN(floordist))) {
      local_58 = sector_t::CenterFloor(sector);
      local_58 = local_58 + floordist;
      dVar2 = secplane_t::PointToDist(&sector->floorplane,&sector->centerspot,local_58);
      this->m_FloorTarget = dVar2;
      dVar2 = secplane_t::PointToDist(&sector->ceilingplane,&sector->centerspot,local_58);
      this->m_CeilingTarget = dVar2;
    }
    else {
      dVar2 = sector_t::CenterFloor(sector);
      dVar3 = sector_t::CenterCeiling(sector);
      local_58 = (dVar2 + dVar3) * 0.5;
      dVar2 = secplane_t::PointToDist(&sector->floorplane,&sector->centerspot,local_58);
      this->m_FloorTarget = dVar2;
      dVar2 = secplane_t::PointToDist(&sector->ceilingplane,&sector->centerspot,local_58);
      this->m_CeilingTarget = dVar2;
      local_50 = sector_t::CenterFloor(sector);
      local_50 = local_58 - local_50;
    }
    dVar2 = sector_t::CenterCeiling(sector);
    ceilingdist = dVar2 - local_58;
  }
  else {
    if ((floordist != 0.0) || (NAN(floordist))) {
      dVar2 = sector_t::CenterFloor(sector);
      dVar2 = secplane_t::PointToDist(&sector->floorplane,&sector->centerspot,dVar2 - floordist);
      this->m_FloorTarget = dVar2;
    }
    else {
      dVar2 = sector_t::FindLowestFloorSurrounding(sector,&spot);
      dVar3 = secplane_t::PointToDist(&sector->floorplane,spot,dVar2);
      this->m_FloorTarget = dVar3;
      local_50 = secplane_t::ZatPoint(&sector->floorplane,spot);
      local_50 = local_50 - dVar2;
    }
    if ((ceilingdist != 0.0) || (NAN(ceilingdist))) {
      dVar2 = sector_t::CenterCeiling(sector);
      dVar2 = secplane_t::PointToDist(&sector->ceilingplane,&sector->centerspot,dVar2 + ceilingdist)
      ;
      this->m_CeilingTarget = dVar2;
    }
    else {
      dVar2 = sector_t::FindHighestCeilingSurrounding(sector,&spot);
      dVar3 = secplane_t::PointToDist(&sector->ceilingplane,spot,dVar2);
      this->m_CeilingTarget = dVar3;
      dVar3 = secplane_t::ZatPoint(&sector->ceilingplane,spot);
      ceilingdist = dVar2 - dVar3;
    }
  }
  dVar2 = local_38;
  if (ceilingdist < local_50) {
    dVar2 = (ceilingdist * local_38) / local_50;
  }
  this->m_FloorSpeed =
       (double)(-(ulong)(ceilingdist < local_50) & (ulong)local_38 |
               ~-(ulong)(ceilingdist < local_50) & (ulong)((local_50 * local_38) / ceilingdist));
  this->m_CeilingSpeed = dVar2;
  if ((((this->super_DMover).super_DSectorEffect.m_Sector)->Flags & 0x40) == 0) {
    if (sector->seqType < 0) {
      local_3c.Index = (sector->SeqName).super_FName.Index;
      if (local_3c.Index == 0) {
        SN_StartSequence(sector,1,"Floor",0);
      }
      else {
        SN_StartSequence(sector,1,&local_3c,0);
      }
    }
    else {
      SN_StartSequence(sector,1,(int)sector->seqType,SEQ_PLATFORM,0,false);
    }
  }
  return;
}

Assistant:

DPillar::DPillar (sector_t *sector, EPillar type, double speed,
				  double floordist, double ceilingdist, int crush, bool hexencrush)
	: DMover (sector)
{
	double newheight;
	vertex_t *spot;

	sector->floordata = sector->ceilingdata = this;
	m_Interp_Floor = sector->SetInterpolation(sector_t::FloorMove, true);
	m_Interp_Ceiling = sector->SetInterpolation(sector_t::CeilingMove, true);

	m_Type = type;
	m_Crush = crush;
	m_Hexencrush = hexencrush;

	if (type == pillarBuild)
	{
		// If the pillar height is 0, have the floor and ceiling meet halfway
		if (floordist == 0)
		{
			newheight = (sector->CenterFloor () + sector->CenterCeiling ()) / 2;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
			floordist = newheight - sector->CenterFloor ();
		}
		else
		{
			newheight = sector->CenterFloor () + floordist;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
		}
		ceilingdist = sector->CenterCeiling () - newheight;
	}
	else
	{
		// If one of the heights is 0, figure it out based on the
		// surrounding sectors
		if (floordist == 0)
		{
			newheight = sector->FindLowestFloorSurrounding (&spot);
			m_FloorTarget = sector->floorplane.PointToDist (spot, newheight);
			floordist = sector->floorplane.ZatPoint (spot) - newheight;
		}
		else
		{
			newheight = sector->CenterFloor() - floordist;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
		}
		if (ceilingdist == 0)
		{
			newheight = sector->FindHighestCeilingSurrounding (&spot);
			m_CeilingTarget = sector->ceilingplane.PointToDist (spot, newheight);
			ceilingdist = newheight - sector->ceilingplane.ZatPoint (spot);
		}
		else
		{
			newheight = sector->CenterCeiling() + ceilingdist;
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
		}
	}

	// The speed parameter applies to whichever part of the pillar
	// travels the farthest. The other part's speed is then set so
	// that it arrives at its destination at the same time.
	if (floordist > ceilingdist)
	{
		m_FloorSpeed = speed;
		m_CeilingSpeed = speed * ceilingdist / floordist;
	}
	else
	{
		m_CeilingSpeed = speed;
		m_FloorSpeed = speed * floordist / ceilingdist;
	}

	if (!(m_Sector->Flags & SECF_SILENTMOVE))
	{
		if (sector->seqType >= 0)
		{
			SN_StartSequence(sector, CHAN_FLOOR, sector->seqType, SEQ_PLATFORM, 0);
		}
		else if (sector->SeqName != NAME_None)
		{
			SN_StartSequence(sector, CHAN_FLOOR, sector->SeqName, 0);
		}
		else
		{
			SN_StartSequence(sector, CHAN_FLOOR, "Floor", 0);
		}
	}
}